

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int Strsafe_insert(char *data)

{
  s_x1node **ppsVar1;
  s_x1node *psVar2;
  s_x1 *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  s_x1node *psVar8;
  s_x1node *psVar9;
  s_x1node *psVar10;
  x1node *newnp;
  x1node *oldnp;
  s_x1 array;
  int size;
  int i;
  int ph;
  int h;
  x1node *np;
  char *data_local;
  
  if (x1a == (s_x1 *)0x0) {
    data_local._4_4_ = 0;
  }
  else {
    uVar4 = strhash(data);
    for (_ph = x1a->ht[(int)(uVar4 & x1a->size - 1U)]; _ph != (s_x1node *)0x0; _ph = _ph->next) {
      iVar5 = strcmp(_ph->data,data);
      if (iVar5 == 0) {
        return 0;
      }
    }
    if (x1a->size <= x1a->count) {
      iVar6 = x1a->size * 2;
      iVar5 = x1a->count;
      psVar8 = (s_x1node *)malloc((long)iVar6 << 5);
      if (psVar8 == (s_x1node *)0x0) {
        return 0;
      }
      psVar9 = psVar8 + iVar6;
      for (array.ht._4_4_ = 0; array.ht._4_4_ < iVar6; array.ht._4_4_ = array.ht._4_4_ + 1) {
        (&psVar9->data)[array.ht._4_4_] = (char *)0x0;
      }
      for (array.ht._4_4_ = 0; array.ht._4_4_ < x1a->count; array.ht._4_4_ = array.ht._4_4_ + 1) {
        psVar2 = x1a->tbl;
        uVar7 = strhash(psVar2[array.ht._4_4_].data);
        uVar7 = uVar7 & iVar6 - 1U;
        psVar10 = psVar8 + array.ht._4_4_;
        if ((&psVar9->data)[(int)uVar7] != (char *)0x0) {
          *(s_x1node ***)((&psVar9->data)[(int)uVar7] + 0x10) = &psVar10->next;
        }
        psVar10->next = (s_x1node *)(&psVar9->data)[(int)uVar7];
        psVar10->data = psVar2[array.ht._4_4_].data;
        psVar10->from = (s_x1node **)(&psVar9->data + (int)uVar7);
        (&psVar9->data)[(int)uVar7] = (char *)psVar10;
      }
      free(x1a->tbl);
      psVar3 = x1a;
      psVar3->size = iVar6;
      psVar3->count = iVar5;
      psVar3->tbl = psVar8;
      psVar3->ht = (s_x1node **)psVar9;
    }
    uVar4 = uVar4 & x1a->size - 1U;
    ppsVar1 = &x1a->tbl;
    iVar5 = x1a->count;
    x1a->count = iVar5 + 1;
    psVar8 = *ppsVar1 + iVar5;
    psVar8->data = data;
    if (x1a->ht[(int)uVar4] != (s_x1node *)0x0) {
      x1a->ht[(int)uVar4]->from = &psVar8->next;
    }
    psVar8->next = x1a->ht[(int)uVar4];
    x1a->ht[(int)uVar4] = psVar8;
    psVar8->from = x1a->ht + (int)uVar4;
    data_local._4_4_ = 1;
  }
  return data_local._4_4_;
}

Assistant:

int Strsafe_insert(const char *data)
{
  x1node *np;
  int h;
  int ph;

  if( x1a==0 ) return 0;
  ph = strhash(data);
  h = ph & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x1a->count>=x1a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x1 array;
    array.size = size = x1a->size*2;
    array.count = x1a->count;
    array.tbl = (x1node*)malloc(
      (sizeof(x1node) + sizeof(x1node*))*size );
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x1node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x1a->count; i++){
      x1node *oldnp, *newnp;
      oldnp = &(x1a->tbl[i]);
      h = strhash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x1a->tbl);
    *x1a = array;
  }
  /* Insert the new data */
  h = ph & (x1a->size-1);
  np = &(x1a->tbl[x1a->count++]);
  np->data = data;
  if( x1a->ht[h] ) x1a->ht[h]->from = &(np->next);
  np->next = x1a->ht[h];
  x1a->ht[h] = np;
  np->from = &(x1a->ht[h]);
  return 1;
}